

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O2

int __thiscall
Acceptor<Client>::accept(Acceptor<Client> *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int socket;
  AcceptException *this_00;
  undefined4 in_register_00000034;
  long lVar1;
  allocator<char> local_31;
  string local_30;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  socket = ::accept(*(int *)(lVar1 + 8),(sockaddr *)(lVar1 + 0x10),(socklen_t *)(lVar1 + 0xc));
  if (-1 < socket) {
    Client::Client((Client *)this,socket);
    return (int)this;
  }
  this_00 = (AcceptException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Accept",&local_31);
  AcceptException::AcceptException(this_00,&local_30);
  __cxa_throw(this_00,&AcceptException::typeinfo,AcceptException::~AcceptException);
}

Assistant:

T Acceptor<T>::accept() { 
    int new_socket;
    if ((new_socket = ::accept(server_fd, (sockaddr *)&address,  
                       (socklen_t*)&addrlen))<0) { 
        throw AcceptException("Accept");
    } 

    return T(new_socket);
}